

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * MyGame_Example_Any_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *pcVar2;
  char *pcVar3;
  uint64_t uStack_50;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 < 0x4d6f6e7374657200) {
    if ((uVar1 & 0x7fffff0000000000) != 0x416c740000000000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,3,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uStack_50 = 4;
  }
  else if (uVar1 == 0x4d6f6e7374657232) {
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,8,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uStack_50 = 3;
  }
  else {
    pcVar3 = buf;
    if (((uVar1 & 0xffffffffffffff00) == 0x4d6f6e7374657200) &&
       (pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,7,aggregate), pcVar3 = pcVar2,
       pcVar2 != buf)) {
      uStack_50 = 1;
    }
    else if ((int)(uVar1 >> 0x20) == 0x4e4f4e45) {
      pcVar2 = flatcc_json_parser_match_constant(ctx,pcVar3,end,4,aggregate);
      if (pcVar2 == pcVar3) {
        return buf;
      }
      uStack_50 = 0;
    }
    else {
      if (uVar1 != 0x5465737453696d70) {
        return buf;
      }
      uVar1 = flatcc_json_parser_symbol_part(pcVar3 + 8,end);
      if (uVar1 != 0x6c655461626c6557) {
        return buf;
      }
      pcVar3 = pcVar3 + 0x10;
      uVar1 = flatcc_json_parser_symbol_part(pcVar3,end);
      if (uVar1 >> 8 != 0x697468456e756d) {
        return buf;
      }
      pcVar2 = flatcc_json_parser_match_constant(ctx,pcVar3,end,7,aggregate);
      if (pcVar2 == pcVar3) {
        return buf;
      }
      uStack_50 = 2;
    }
  }
  *value = uStack_50;
  *value_sign = 0;
  return pcVar2;
}

Assistant:

static const char *MyGame_Example_Any_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x4d6f6e7374657200) { /* branch "Monster" */
        if ((w & 0xffffff0000000000) == 0x416c740000000000) { /* "Alt" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 3, aggregate);
            if (buf != mark) {
                *value = UINT64_C(4), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "Alt" */
            return unmatched;
        } /* "Alt" */
    } else { /* branch "Monster" */
        if (w == 0x4d6f6e7374657232) { /* "Monster2" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 8, aggregate);
            if (buf != mark) {
                *value = UINT64_C(3), *value_sign = 0;
            } else {
                goto pfguard1;
            }
        } else { /* "Monster2" */
            if ((w & 0xffffffffffffff00) == 0x4d6f6e7374657200) { /* "Monster" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(1), *value_sign = 0;
                } else {
                    goto pfguard1;
                }
            } else { /* "Monster" */
                goto pfguard1;
            } /* "Monster" */
        } /* "Monster2" */
        goto endpfguard1;
pfguard1:
        if ((w & 0xffffffff00000000) == 0x4e4f4e4500000000) { /* "NONE" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(0), *value_sign = 0;
            } else {
                goto pfguard2;
            }
        } else { /* "NONE" */
            goto pfguard2;
        } /* "NONE" */
        goto endpfguard2;
pfguard2:
        if (w == 0x5465737453696d70) { /* descend "TestSimp" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if (w == 0x6c655461626c6557) { /* descend "leTableW" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if ((w & 0xffffffffffffff00) == 0x697468456e756d00) { /* "ithEnum" */
                    buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
                    if (buf != mark) {
                        *value = UINT64_C(2), *value_sign = 0;
                    } else {
                        return unmatched;
                    }
                } else { /* "ithEnum" */
                    return unmatched;
                } /* "ithEnum" */
            } else { /* descend "leTableW" */
                return unmatched;
            } /* descend "leTableW" */
        } else { /* descend "TestSimp" */
            return unmatched;
        } /* descend "TestSimp" */
endpfguard2:
        (void)0;
endpfguard1:
        (void)0;
    } /* branch "Monster" */
    return buf;
}